

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_fileio.cpp
# Opt level: O0

PathList_t *
Kumu::FindInPaths(IPathMatch *Pattern,PathList_t *SearchPaths,PathList_t *FoundPaths,bool one_shot,
                 char separator)

{
  bool bVar1;
  reference SearchDir;
  _Self local_40;
  _List_node_base *local_38;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  const_iterator si;
  char separator_local;
  bool one_shot_local;
  PathList_t *FoundPaths_local;
  PathList_t *SearchPaths_local;
  IPathMatch *Pattern_local;
  
  si._M_node._6_1_ = separator;
  si._M_node._7_1_ = one_shot;
  std::
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_List_const_iterator(&local_30);
  local_38 = (_List_node_base *)
             std::__cxx11::
             list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(SearchPaths);
  local_30._M_node = local_38;
  while( true ) {
    local_40._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(SearchPaths);
    bVar1 = std::operator!=(&local_30,&local_40);
    if (!bVar1) {
      return FoundPaths;
    }
    SearchDir = std::
                _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator*(&local_30);
    FindInPath(Pattern,SearchDir,FoundPaths,(bool)(si._M_node._7_1_ & 1),si._M_node._6_1_);
    if (((si._M_node._7_1_ & 1) != 0) &&
       (bVar1 = std::__cxx11::
                list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty(FoundPaths), !bVar1)) break;
    std::
    _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_30,0);
  }
  return FoundPaths;
}

Assistant:

Kumu::PathList_t&
Kumu::FindInPaths(const IPathMatch& Pattern, const Kumu::PathList_t& SearchPaths,
		  Kumu::PathList_t& FoundPaths, bool one_shot, char separator)
{
  PathList_t::const_iterator si;
  for ( si = SearchPaths.begin(); si != SearchPaths.end(); si++ )
    {
      FindInPath(Pattern, *si, FoundPaths, one_shot, separator);

      if ( one_shot && ! FoundPaths.empty() )
	break;
    }

  return FoundPaths;
}